

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_posix.h
# Opt level: O3

void snmalloc::PALPOSIX<snmalloc::PALLinux,_&writev,_&fsync>::error(char *str)

{
  iovec iov [3];
  iovec local_48;
  char *local_38;
  size_t local_30;
  char *local_28;
  undefined8 local_20;
  
  local_48.iov_base = "\n";
  local_48.iov_len = 1;
  local_38 = str;
  local_30 = strlen(str);
  local_28 = "\n";
  local_20 = 1;
  writev(2,&local_48,3);
  fsync(2);
  abort();
}

Assistant:

[[noreturn]] static void error(const char* const str) noexcept
    {
      /// by this part, the allocator is failed; so we cannot assume
      /// subsequent allocation will work.
      /// @attention: since the program is failing, we do not guarantee that
      /// previous bytes in stdout will be flushed
      void* nl = const_cast<char*>("\n");
      struct iovec iov[] = {
        {nl, 1}, {const_cast<char*>(str), strlen(str)}, {nl, 1}};
      UNUSED(writev(STDERR_FILENO, iov, sizeof(iov) / sizeof(struct iovec)));
      UNUSED(fsync(STDERR_FILENO));
      print_stack_trace();
      abort();
    }